

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowGetObjSet(Aig_Man_t *p,Vec_Ptr_t *vLower,int iStart,int nSize,Vec_Ptr_t *vSet)

{
  int iVar1;
  void *Entry;
  undefined4 local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSet_local;
  int nSize_local;
  int iStart_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  Vec_PtrClear(vSet);
  for (local_34 = 0; local_34 < nSize; local_34 = local_34 + 1) {
    iVar1 = Vec_PtrSize(vLower);
    Entry = Vec_PtrEntry(vLower,(iStart + local_34) % iVar1);
    Vec_PtrPush(vSet,Entry);
  }
  return;
}

Assistant:

void Llb_ManFlowGetObjSet( Aig_Man_t * p, Vec_Ptr_t * vLower, int iStart, int nSize, Vec_Ptr_t * vSet )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vSet );
    for ( i = 0; i < nSize; i++ )
    {
        pObj = (Aig_Obj_t *)Vec_PtrEntry( vLower, (iStart + i) % Vec_PtrSize(vLower) );
        Vec_PtrPush( vSet, pObj );
    }
}